

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O2

DeepTiledOutputFile * __thiscall
Imf_3_4::MultiPartOutputFile::getOutputPart<Imf_3_4::DeepTiledOutputFile>
          (MultiPartOutputFile *this,int partNumber)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  iterator iVar2;
  mapped_type *ppGVar3;
  DeepTiledOutputFile *this_00;
  ostream *poVar4;
  ArgExc *this_01;
  int partNumber_local;
  stringstream _iex_throw_s;
  ostream local_1a0 [376];
  
  partNumber_local = partNumber;
  if ((-1 < partNumber) &&
     (__mutex = (pthread_mutex_t *)this->_data,
     partNumber < (int)((*(long *)((long)__mutex + 0x90) - *(long *)((long)__mutex + 0x88)) / 0x38))
     ) {
    std::mutex::lock((mutex *)&__mutex->__data);
    iVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_Imf_3_4::GenericOutputFile_*>,_std::_Select1st<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
            ::find(&(this->_data->_outputFiles)._M_t,&partNumber_local);
    pDVar1 = this->_data;
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(pDVar1->_outputFiles)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = (DeepTiledOutputFile *)operator_new(0x10);
      DeepTiledOutputFile::DeepTiledOutputFile
                (this_00,(pDVar1->parts).
                         super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[partNumber_local]);
      __iex_throw_s = partNumber_local;
      std::
      _Rb_tree<int,std::pair<int_const,Imf_3_4::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_3_4::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_3_4::GenericOutputFile*>>>
      ::_M_emplace_unique<std::pair<int,Imf_3_4::GenericOutputFile*>>
                ((_Rb_tree<int,std::pair<int_const,Imf_3_4::GenericOutputFile*>,std::_Select1st<std::pair<int_const,Imf_3_4::GenericOutputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_3_4::GenericOutputFile*>>>
                  *)&this->_data->_outputFiles,
                 (pair<int,_Imf_3_4::GenericOutputFile_*> *)&_iex_throw_s);
    }
    else {
      ppGVar3 = std::
                map<int,_Imf_3_4::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
                ::operator[](&pDVar1->_outputFiles,&partNumber_local);
      this_00 = (DeepTiledOutputFile *)*ppGVar3;
    }
    pthread_mutex_unlock(__mutex);
    return this_00;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar4 = std::operator<<(local_1a0,
                           "MultiPartOutputFile::getOutputPart called with invalid part number  ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,partNumber);
  poVar4 = std::operator<<(poVar4," on file with ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," parts");
  this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_01,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_01,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

T*
MultiPartOutputFile::getOutputPart (int partNumber)
{

    if (partNumber < 0 || partNumber >= int (_data->_headers.size ()))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartOutputFile::getOutputPart called with invalid part number  "
                << partNumber << " on file with " << _data->_headers.size ()
                << " parts");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data);
#endif
    if (_data->_outputFiles.find (partNumber) == _data->_outputFiles.end ())
    {
        T* file = new T (_data->parts[partNumber]);
        _data->_outputFiles.insert (
            std::make_pair (partNumber, (GenericOutputFile*) file));
        return file;
    }
    else
        return (T*) _data->_outputFiles[partNumber];
}